

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.cpp
# Opt level: O0

void __thiscall CPacker::AddInt(CPacker *this,int i)

{
  uchar *puVar1;
  int in_ESI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x810) == 0) {
    if (*(long *)(in_RDI + 0x808) - *(long *)(in_RDI + 0x800) < 6) {
      dbg_break();
      *(undefined4 *)(in_RDI + 0x810) = 1;
    }
    else {
      puVar1 = CVariableInt::Pack(*(uchar **)(in_RDI + 0x800),in_ESI);
      *(uchar **)(in_RDI + 0x800) = puVar1;
    }
  }
  return;
}

Assistant:

void CPacker::AddInt(int i)
{
	if(m_Error)
		return;

	// make sure that we have space enough
	if(m_pEnd - m_pCurrent <= CVariableInt::MAX_BYTES_PACKED)
	{
		dbg_break();
		m_Error = 1;
	}
	else
		m_pCurrent = CVariableInt::Pack(m_pCurrent, i);
}